

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeViewPrivate::layout
          (QTreeViewPrivate *this,int i,bool recursiveExpanding,bool afterIsUninitialized)

{
  QList<QTreeViewItem> *this_00;
  QTreeViewItem *pQVar1;
  byte bVar2;
  QTreeView *this_01;
  QTreeViewItem *pQVar3;
  QAbstractItemModel *pQVar4;
  QWidgetData *pQVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint count;
  int iVar10;
  ItemFlags IVar11;
  pointer pQVar12;
  ulong extraout_RDX;
  ulong uVar13;
  ulong extraout_RDX_00;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  pointer local_e8;
  ulong local_d0;
  QModelIndex ret;
  undefined1 *local_88;
  undefined1 *puStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  int local_50;
  undefined8 local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_88 = (QPersistentModelIndexData *)0xffffffffffffffff;
  puStack_80 = (undefined1 *)0x0;
  tStack_78.ptr = (QAbstractItemModel *)0x0;
  ret.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  ret._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ret.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  uVar18 = (ulong)(uint)i;
  if (i < 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&ret,&(this->super_QAbstractItemViewPrivate).root);
    uVar16 = (this->viewItems).d.size;
  }
  else {
    uVar16 = (this->viewItems).d.size;
    if (uVar16 <= uVar18) goto LAB_005451e2;
    pQVar3 = (this->viewItems).d.ptr;
    pQVar1 = pQVar3 + uVar18;
    ret.r = (pQVar1->index).r;
    ret.c = (pQVar1->index).c;
    ret.i = (pQVar1->index).i;
    ret.m.ptr = pQVar3[uVar18].index.m.ptr;
    if ((((pQVar1->index).r < 0) || ((pQVar1->index).c < 0)) ||
       (ret.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_005451e2;
  }
  pQVar4 = (this->super_QAbstractItemViewPrivate).model;
  cVar6 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&ret);
  count = 0;
  if (cVar6 != '\0') {
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    cVar6 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&ret);
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    if (cVar6 == '\0') {
      count = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&ret);
    }
    else {
      (**(code **)(*(long *)pQVar4 + 0x128))(pQVar4,&ret);
      iVar8 = this->defaultItemHeight;
      if (iVar8 < 1) {
        iVar14 = 0;
        iVar8 = (**(code **)(*(long *)&(this_01->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x1f8))(this_01,0);
        uVar13 = extraout_RDX;
        if (iVar8 != 0) goto LAB_00544c73;
      }
      else {
LAB_00544c73:
        pQVar5 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
                 ->data;
        iVar9 = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
        iVar14 = iVar9 / iVar8;
        uVar13 = (long)iVar9 % (long)iVar8 & 0xffffffff;
      }
      uVar17 = 0xffffffff;
      while (((pQVar4 = (this->super_QAbstractItemViewPrivate).model,
              count = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&ret,uVar13), (int)count < iVar14
              && (count != uVar17)) &&
             (pQVar4 = (this->super_QAbstractItemViewPrivate).model,
             cVar6 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&ret), cVar6 != '\0'))) {
        pQVar4 = (this->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar4 + 0x128))(pQVar4,&ret);
        uVar13 = extraout_RDX_00;
        uVar17 = count;
      }
    }
  }
  this_00 = &this->viewItems;
  if (i == -1) {
    if (this->uniformRowHeights == true) {
      local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (this->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x60))((QModelIndex *)&local_68,pQVar4,0,0,&ret);
      iVar8 = QTreeView::indexRowSizeHint(this_01,(QModelIndex *)&local_68);
      this->defaultItemHeight = iVar8;
    }
    QList<QTreeViewItem>::resize(this_00,(long)(int)count);
    afterIsUninitialized = true;
    iVar8 = 0;
    bVar19 = true;
    local_d0 = 0;
  }
  else {
    pQVar12 = QList<QTreeViewItem>::data(this_00);
    bVar19 = *(uint *)&pQVar12[i].field_0x1c >> 4 != count;
    if (bVar19) {
      if (afterIsUninitialized) {
        if (0 < (int)count) {
          QList<QTreeViewItem>::resize(this_00,(ulong)count + (this->viewItems).d.size);
        }
      }
      else {
        local_68 = (QPersistentModelIndexData *)0xffffffffffffffff;
        puStack_60 = (undefined1 *)0x0;
        local_58.ptr = (QAbstractItemModel *)0x0;
        local_50 = -1;
        local_4c = 0;
        insertViewItems(this,i + 1,count,(QTreeViewItem *)&local_68);
      }
    }
    iVar8 = i + 1;
    if (i < 0) {
      local_d0 = 0;
    }
    else {
      local_d0 = *(long *)&(this->viewItems).d.ptr[uVar18].field_0x1c + 0x100000000U &
                 0xffff00000000;
    }
  }
  iVar9 = count + iVar8;
  iVar14 = 0;
  uVar17 = 0;
  iVar10 = 0;
  iVar15 = 0;
  local_e8 = (pointer)0x0;
  for (; iVar8 < iVar9; iVar8 = iVar8 + 1) {
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_68,pQVar4,iVar14,0,&ret);
    tStack_78.ptr = local_58.ptr;
    local_88 = local_68;
    puStack_80 = puStack_60;
    bVar7 = isRowHidden(this,(QModelIndex *)&local_88);
    if (bVar7) {
      iVar10 = iVar15 - uVar17;
      uVar17 = uVar17 + 1;
      iVar10 = iVar8 + iVar10 + -1;
    }
    else {
      if (local_e8 != (pointer)0x0) {
        local_e8->field_0x1c = local_e8->field_0x1c | 8;
      }
      iVar10 = (iVar15 - uVar17) + iVar8;
      pQVar12 = QList<QTreeViewItem>::data(this_00);
      local_e8 = pQVar12 + iVar10;
      *(undefined1 **)&pQVar12[iVar10].index = local_88;
      pQVar12[iVar10].index.i = (quintptr)puStack_80;
      pQVar12[iVar10].index.m.ptr = tStack_78.ptr;
      pQVar12[iVar10].parentItem = i;
      *(ulong *)&pQVar12[iVar10].field_0x1c = *(uint *)&pQVar12[iVar10].field_0x1c | local_d0;
      bVar7 = QTreeView::isFirstColumnSpanned(this_01,(int)local_88,&ret);
      *(ulong *)&pQVar12[iVar10].field_0x1c =
           (*(ulong *)&pQVar12[iVar10].field_0x1c & 0xffffffff00000004) + (ulong)bVar7 * 2;
      if ((recursiveExpanding) &&
         (IVar11 = QModelIndex::flags((QModelIndex *)&local_88),
         -1 < (char)IVar11.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                    super_QFlagsStorage<Qt::ItemFlag>.i)) {
LAB_00545022:
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_68,(QModelIndex *)&local_88);
        bVar7 = storeExpanded(this,(QPersistentModelIndex *)&local_68);
        if (bVar7) {
          bVar2 = *(byte *)(*(long *)&(this_01->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget.field_0x8 + 0x30);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
          if ((bVar2 & 2) == 0) {
            QTreeView::expanded(this_01,(QModelIndex *)&local_88);
          }
        }
        else {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
        }
LAB_005450c2:
        local_e8->field_0x1c = local_e8->field_0x1c | 1;
        layout(this,iVar10,recursiveExpanding,afterIsUninitialized);
        pQVar12 = QList<QTreeViewItem>::data(this_00);
        local_e8 = pQVar12 + iVar10;
        uVar18 = *(ulong *)&pQVar12[iVar10].field_0x1c;
        iVar15 = iVar15 + ((uint)(uVar18 >> 4) & 0xfffffff);
        *(ulong *)&pQVar12[iVar10].field_0x1c =
             (uVar18 & 0xfffffffffffffffb) + (ulong)(0xf < (uint)uVar18) * 4;
      }
      else {
        bVar7 = isIndexExpanded(this,(QModelIndex *)&local_88);
        if (bVar7) {
          if (recursiveExpanding) goto LAB_00545022;
          goto LAB_005450c2;
        }
        bVar7 = hasVisibleChildren(this,(QModelIndex *)&local_88);
        *(ulong *)&local_e8->field_0x1c =
             (*(ulong *)&local_e8->field_0x1c & 0xfffffffffffffffb) + (ulong)bVar7 * 4;
      }
      iVar10 = (iVar8 - uVar17) + iVar15;
    }
    iVar14 = iVar14 + 1;
  }
  if (0 < (int)uVar17) {
    if (afterIsUninitialized == false) {
      removeViewItems(this,iVar10 + 1,uVar17);
    }
    else {
      QList<QTreeViewItem>::resize(this_00,(this->viewItems).d.size - (ulong)uVar17);
    }
  }
  if (bVar19) {
    for (; -1 < i; i = pQVar12[(uint)i].parentItem) {
      pQVar12 = QList<QTreeViewItem>::data(this_00);
      *(ulong *)&pQVar12[(uint)i].field_0x1c =
           *(ulong *)&pQVar12[(uint)i].field_0x1c & 0xffffffff0000000f |
           (ulong)((count - uVar17) * 0x10 + (int)*(ulong *)&pQVar12[(uint)i].field_0x1c &
                  0xfffffff0);
      pQVar12 = QList<QTreeViewItem>::data(this_00);
    }
  }
  this->pendingAccessibilityUpdate =
       (bool)(this->pendingAccessibilityUpdate | uVar16 != (this->viewItems).d.size);
LAB_005451e2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::layout(int i, bool recursiveExpanding, bool afterIsUninitialized)
{
    Q_Q(QTreeView);
    QModelIndex current;
    QModelIndex parent = (i < 0) ? (QModelIndex)root : modelIndex(i);

    if (i>=0 && !parent.isValid()) {
        //modelIndex() should never return something invalid for the real items.
        //This can happen if columncount has been set to 0.
        //To avoid infinite loop we stop here.
        return;
    }

#if QT_CONFIG(accessibility)
    // QAccessibleTree's rowCount implementation uses viewItems.size(), so
    // we need to invalidate any cached accessibility data structures if
    // that value changes during the run of this function.
    const auto resetModelIfNeeded = qScopeGuard([oldViewItemsSize = viewItems.size(), this]{
        pendingAccessibilityUpdate |= oldViewItemsSize != viewItems.size();
    });
#endif

    int count = 0;
    if (model->hasChildren(parent)) {
        if (model->canFetchMore(parent)) {
            // fetchMore first, otherwise we might not yet have any data for sizeHintForRow
            model->fetchMore(parent);
            // guestimate the number of items in the viewport, and fetch as many as might fit
            const int itemHeight = defaultItemHeight <= 0 ? q->sizeHintForRow(0) : defaultItemHeight;
            const int viewCount = itemHeight ? viewport->height() / itemHeight : 0;
            int lastCount = -1;
            while ((count = model->rowCount(parent)) < viewCount &&
                   count != lastCount && model->canFetchMore(parent)) {
                model->fetchMore(parent);
                lastCount = count;
            }
        } else {
            count = model->rowCount(parent);
        }
    }

    bool expanding = true;
    if (i == -1) {
        if (uniformRowHeights) {
            QModelIndex index = model->index(0, 0, parent);
            defaultItemHeight = q->indexRowSizeHint(index);
        }
        viewItems.resize(count);
        afterIsUninitialized = true;
    } else if (q20::cmp_not_equal(viewItems[i].total, count)) {
        if (!afterIsUninitialized)
            insertViewItems(i + 1, count, QTreeViewItem()); // expand
        else if (count > 0)
            viewItems.resize(viewItems.size() + count);
    } else {
        expanding = false;
    }

    int first = i + 1;
    int level = (i >= 0 ? viewItems.at(i).level + 1 : 0);
    int hidden = 0;
    int last = 0;
    int children = 0;
    QTreeViewItem *item = nullptr;
    for (int j = first; j < first + count; ++j) {
        current = model->index(j - first, 0, parent);
        if (isRowHidden(current)) {
            ++hidden;
            last = j - hidden + children;
        } else {
            last = j - hidden + children;
            if (item)
                item->hasMoreSiblings = true;
            item = &viewItems[last];
            item->index = current;
            item->parentItem = i;
            item->level = level;
            item->height = 0;
            item->spanning = q->isFirstColumnSpanned(current.row(), parent);
            item->expanded = false;
            item->total = 0;
            item->hasMoreSiblings = false;
            if ((recursiveExpanding && !(current.flags() & Qt::ItemNeverHasChildren)) || isIndexExpanded(current)) {
                if (recursiveExpanding && storeExpanded(current) && !q->signalsBlocked())
                    emit q->expanded(current);
                item->expanded = true;
                layout(last, recursiveExpanding, afterIsUninitialized);
                item = &viewItems[last];
                children += item->total;
                item->hasChildren = item->total > 0;
                last = j - hidden + children;
            } else {
                item->hasChildren = hasVisibleChildren(current);
            }
        }
    }

    // remove hidden items
    if (hidden > 0) {
        if (!afterIsUninitialized)
            removeViewItems(last + 1, hidden);
        else
            viewItems.resize(viewItems.size() - hidden);
    }

    if (!expanding)
        return; // nothing changed

    while (i > -1) {
        viewItems[i].total += count - hidden;
        i = viewItems[i].parentItem;
    }
}